

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

void __thiscall vox::VoxWriter::PrintStats(VoxWriter *this)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pVVar5;
  reference __k;
  mapped_type *pmVar6;
  size_type sVar7;
  mapped_type_conflict *pmVar8;
  pointer ppVar9;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_> local_118;
  _Self local_110;
  _Self local_108;
  reference local_100;
  pair<const_unsigned_int,_unsigned_long> *frame_count;
  iterator __end2_1;
  iterator __begin2_1;
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *__range2_1;
  size_t voxels_total;
  pair<const_unsigned_int,_vox::XYZI> *key_xyzi;
  const_iterator __end2;
  const_iterator __begin2;
  map<unsigned_int,_vox::XYZI,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vox::XYZI>_>_>
  *__range2;
  VoxCube *cube;
  const_iterator __end1;
  const_iterator __begin1;
  vector<vox::VoxCube,_std::allocator<vox::VoxCube>_> *__range1;
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  frame_counts;
  double local_48;
  dvec3 local_40;
  dvec3 local_28;
  VoxWriter *local_10;
  VoxWriter *this_local;
  
  local_10 = this;
  poVar3 = std::operator<<((ostream *)&std::cout,"---- Stats ------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Volume : ");
  ct::dAABBCC::Size(&local_28,&this->maxVolume);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28.x);
  poVar3 = std::operator<<(poVar3," x ");
  ct::dAABBCC::Size(&local_40,&this->maxVolume);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_40.y);
  poVar3 = std::operator<<(poVar3," x ");
  ct::dAABBCC::Size((dvec3 *)&frame_counts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    &this->maxVolume);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_48);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"count cubes : ");
  sVar4 = std::vector<vox::VoxCube,_std::allocator<vox::VoxCube>_>::size(&this->cubes);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::map((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
         *)&__range1);
  __end1 = std::vector<vox::VoxCube,_std::allocator<vox::VoxCube>_>::begin(&this->cubes);
  cube = (VoxCube *)std::vector<vox::VoxCube,_std::allocator<vox::VoxCube>_>::end(&this->cubes);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_vox::VoxCube_*,_std::vector<vox::VoxCube,_std::allocator<vox::VoxCube>_>_>
                                     *)&cube), bVar2) {
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_vox::VoxCube_*,_std::vector<vox::VoxCube,_std::allocator<vox::VoxCube>_>_>
             ::operator*(&__end1);
    __end2 = std::
             map<unsigned_int,_vox::XYZI,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vox::XYZI>_>_>
             ::begin(&pVVar5->xyzis);
    key_xyzi = (pair<const_unsigned_int,_vox::XYZI> *)
               std::
               map<unsigned_int,_vox::XYZI,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vox::XYZI>_>_>
               ::end(&pVVar5->xyzis);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&key_xyzi), bVar2) {
      __k = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_vox::XYZI>_>::operator*
                      (&__end2);
      iVar1 = (__k->second).numVoxels;
      pmVar6 = std::
               map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::operator[]((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                             *)&__range1,&__k->first);
      *pmVar6 = (long)iVar1 + *pmVar6;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_vox::XYZI>_>::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_vox::VoxCube_*,_std::vector<vox::VoxCube,_std::allocator<vox::VoxCube>_>_>
    ::operator++(&__end1);
  }
  __range2_1 = (map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                *)0x0;
  sVar7 = std::
          map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::size((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                  *)&__range1);
  if (sVar7 < 2) {
    bVar2 = std::
            map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
            ::empty((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                     *)&__range1);
    if (!bVar2) {
      local_118._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
           ::begin((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)&__range1);
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_>::operator->
                         (&local_118);
      __range2_1 = (map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)ppVar9->second;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"count key frames : ");
    sVar7 = std::
            map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
            ::size((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)&__range1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar7);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __end2_1 = std::
               map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::begin((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                        *)&__range1);
    frame_count = (pair<const_unsigned_int,_unsigned_long> *)
                  std::
                  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                  ::end((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                         *)&__range1);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&frame_count), bVar2) {
      local_100 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_>::operator*
                            (&__end2_1);
      poVar3 = std::operator<<((ostream *)&std::cout," o--\\-> key frame : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_100->first);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"     \\-> voxels count : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_100->second);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::find(&this->m_FrameTimes,&local_100->first);
      local_110._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::end(&this->m_FrameTimes);
      bVar2 = std::operator!=(&local_108,&local_110);
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"      \\-> elapsed time : ");
        pmVar8 = std::
                 map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                 ::at(&this->m_FrameTimes,&local_100->first);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pmVar8);
        poVar3 = std::operator<<(poVar3," secs");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      __range2_1 = (map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)(&(__range2_1->_M_t)._M_impl.field_0x0 + local_100->second);
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_long>_>::operator++(&__end2_1);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"voxels total : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)__range2_1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"total elapsed time : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_TotalTime);
  poVar3 = std::operator<<(poVar3," secs");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~map((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          *)&__range1);
  return;
}

Assistant:

void VoxWriter::PrintStats() const {
    std::cout << "---- Stats ------------------------------" << std::endl;
    std::cout << "Volume : " << maxVolume.Size().x << " x " << maxVolume.Size().y << " x " << maxVolume.Size().z << std::endl;
    std::cout << "count cubes : " << cubes.size() << std::endl;
    std::map<KeyFrame, size_t> frame_counts;
    for (const auto& cube : cubes) {
        for (auto& key_xyzi : cube.xyzis) {
            frame_counts[key_xyzi.first] += key_xyzi.second.numVoxels;
        }
    }
    size_t voxels_total = 0U;
    if (frame_counts.size() > 1U) {
        std::cout << "count key frames : " << frame_counts.size() << std::endl;
        std::cout << "-----------------------------------------" << std::endl;
        for (const auto& frame_count : frame_counts) {
            std::cout << " o--\\-> key frame : " << frame_count.first << std::endl;
            std::cout << "     \\-> voxels count : " << frame_count.second << std::endl;
            if (m_FrameTimes.find(frame_count.first) != m_FrameTimes.end()) {
                std::cout << "      \\-> elapsed time : " << m_FrameTimes.at(frame_count.first) << " secs" << std::endl;
            }
            voxels_total += frame_count.second;
        }
        std::cout << "-----------------------------------------" << std::endl;
    } else if (!frame_counts.empty()) {
        voxels_total = frame_counts.begin()->second;
    }
    std::cout << "voxels total : " << voxels_total << std::endl;
    std::cout << "total elapsed time : " << m_TotalTime << " secs" << std::endl;
    std::cout << "-----------------------------------------" << std::endl;
}